

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O0

aom_codec_err_t
aom_read_obu_header_and_size
          (uint8_t *data,size_t bytes_available,int is_annexb,ObuHeader *obu_header,
          size_t *payload_size,size_t *bytes_read)

{
  aom_codec_err_t aVar1;
  aom_read_bit_buffer *rb_00;
  long *in_RCX;
  int in_EDX;
  long in_RSI;
  size_t *in_RDI;
  long *in_R8;
  long *in_R9;
  aom_read_bit_buffer rb;
  aom_codec_err_t status;
  size_t obu_size;
  size_t length_field_size_payload;
  size_t length_field_size_obu;
  ObuHeader *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  uint8_t *data_00;
  aom_codec_err_t local_4;
  
  if ((in_EDX == 0) ||
     (local_4 = read_obu_size(in_stack_ffffffffffffff98,
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
     local_4 == AOM_CODEC_OK)) {
    rb_00 = (aom_read_bit_buffer *)((long)in_RDI + in_RSI);
    uVar2 = 0;
    data_00 = (uint8_t *)0x0;
    local_4 = read_obu_header(rb_00,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff78);
    if (local_4 == AOM_CODEC_OK) {
      if (*(int *)((long)in_RCX + 0xc) == 0) {
        if (*in_RCX != 0) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        *in_R8 = -*in_RCX;
      }
      else {
        aVar1 = read_obu_size(data_00,CONCAT44(in_stack_ffffffffffffff94,uVar2),(size_t *)rb_00,
                              in_RDI);
        if (aVar1 != AOM_CODEC_OK) {
          return aVar1;
        }
      }
      *in_R9 = *in_RCX;
      local_4 = AOM_CODEC_OK;
    }
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_read_obu_header_and_size(const uint8_t *data,
                                             size_t bytes_available,
                                             int is_annexb,
                                             ObuHeader *obu_header,
                                             size_t *const payload_size,
                                             size_t *const bytes_read) {
  size_t length_field_size_obu = 0;
  size_t length_field_size_payload = 0;
  size_t obu_size = 0;
  aom_codec_err_t status;

  if (is_annexb) {
    // Size field comes before the OBU header, and includes the OBU header
    status =
        read_obu_size(data, bytes_available, &obu_size, &length_field_size_obu);

    if (status != AOM_CODEC_OK) return status;
  }

  struct aom_read_bit_buffer rb = { data + length_field_size_obu,
                                    data + bytes_available, 0, NULL, NULL };

  status = read_obu_header(&rb, is_annexb, obu_header);
  if (status != AOM_CODEC_OK) return status;

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    // Derive the payload size from the data we've already read
    if (obu_size < obu_header->size) return AOM_CODEC_CORRUPT_FRAME;

    *payload_size = obu_size - obu_header->size;
  } else {
    // Size field comes after the OBU header, and is just the payload size
    status = read_obu_size(
        data + length_field_size_obu + obu_header->size,
        bytes_available - length_field_size_obu - obu_header->size,
        payload_size, &length_field_size_payload);
    if (status != AOM_CODEC_OK) return status;
  }

  *bytes_read =
      length_field_size_obu + obu_header->size + length_field_size_payload;
  return AOM_CODEC_OK;
}